

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O0

QDBusMenuShortcut * QDBusMenuItem::convertKeySequence(QKeySequence *sequence)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  int i;
  QDBusMenuShortcut *shortcut;
  char16_t *str_6;
  char16_t *str_3;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_4;
  char16_t *str_2;
  char16_t *str_5;
  QString keyName;
  KeyboardModifiers modifiers;
  QStringList tokens;
  undefined4 in_stack_fffffffffffffd48;
  KeyboardModifier other;
  QArrayDataPointer<char16_t> *lhs;
  KeyboardModifier local_2a0;
  QArrayDataPointer<char16_t> *pQVar4;
  QArrayDataPointer<char16_t> local_1e0 [2];
  QLatin1StringView local_1b0;
  QArrayDataPointer<char16_t> local_1a0 [2];
  QLatin1StringView local_170;
  QKeyCombination local_15c;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  QArrayDataPointer<char16_t> local_140 [2];
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_10c;
  QArrayDataPointer<char16_t> local_108 [2];
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_d4;
  QArrayDataPointer<char16_t> local_d0 [2];
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_9c;
  QArrayDataPointer<char16_t> local_98 [2];
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_64;
  QArrayDataPointer<char16_t> local_60 [2];
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_2c;
  int local_28;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->d)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  lhs = in_RDI;
  pQVar4 = in_RDI;
  QList<QList<QString>_>::QList((QList<QList<QString>_> *)0xaf705d);
  local_2a0 = NoModifier;
  while (other = local_2a0, iVar2 = QKeySequence::count((QKeySequence *)in_RDI), (int)other < iVar2)
  {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::QList((QList<QString> *)0xaf70bf);
    local_24.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)0xaaaaaaaa;
    local_28 = (int)QKeySequence::operator[]
                              ((QKeySequence *)CONCAT44(other,in_stack_fffffffffffffd48),0);
    local_24.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QKeyCombination::keyboardModifiers((QKeyCombination *)in_RDI);
    local_2c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&((QFlags<Qt::KeyboardModifier> *)in_RDI,other);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2c);
    if (IVar3 != 0) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_60,(Data *)0x0,L"Super",5);
      QString::QString((QString *)in_RDI,(DataPointer *)CONCAT44(other,in_stack_fffffffffffffd48));
      QList<QString>::operator<<
                ((QList<QString> *)in_RDI,(rvalue_ref)CONCAT44(other,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0xaf7199);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
    }
    local_64.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&((QFlags<Qt::KeyboardModifier> *)in_RDI,other);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_64);
    if (IVar3 != 0) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_98,(Data *)0x0,L"Control",7);
      QString::QString((QString *)in_RDI,(DataPointer *)CONCAT44(other,in_stack_fffffffffffffd48));
      QList<QString>::operator<<
                ((QList<QString> *)in_RDI,(rvalue_ref)CONCAT44(other,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0xaf7253);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
    }
    local_9c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&((QFlags<Qt::KeyboardModifier> *)in_RDI,other);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_9c);
    if (IVar3 != 0) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_d0,(Data *)0x0,L"Alt",3);
      QString::QString((QString *)in_RDI,(DataPointer *)CONCAT44(other,in_stack_fffffffffffffd48));
      QList<QString>::operator<<
                ((QList<QString> *)in_RDI,(rvalue_ref)CONCAT44(other,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0xaf7313);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
    }
    local_d4.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&((QFlags<Qt::KeyboardModifier> *)in_RDI,other);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_d4);
    if (IVar3 != 0) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_108,(Data *)0x0,L"Shift",5);
      QString::QString((QString *)in_RDI,(DataPointer *)CONCAT44(other,in_stack_fffffffffffffd48));
      QList<QString>::operator<<
                ((QList<QString> *)in_RDI,(rvalue_ref)CONCAT44(other,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0xaf73c4);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
    }
    local_10c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&((QFlags<Qt::KeyboardModifier> *)in_RDI,other);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10c);
    if (IVar3 != 0) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_140,(Data *)0x0,L"Num",3);
      QString::QString((QString *)in_RDI,(DataPointer *)CONCAT44(other,in_stack_fffffffffffffd48));
      QList<QString>::operator<<
                ((QList<QString> *)in_RDI,(rvalue_ref)CONCAT44(other,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0xaf7484);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
    }
    local_158 = &DAT_aaaaaaaaaaaaaaaa;
    local_150 = &DAT_aaaaaaaaaaaaaaaa;
    local_148 = &DAT_aaaaaaaaaaaaaaaa;
    local_15c = QKeySequence::operator[]
                          ((QKeySequence *)CONCAT44(other,in_stack_fffffffffffffd48),0);
    QKeyCombination::key(&local_15c);
    QKeySequencePrivate::keyName((Key)((ulong)pQVar4 >> 0x20),(SequenceFormat)pQVar4);
    local_170 = Qt::Literals::StringLiterals::operator____L1((char *)lhs,(size_t)in_RDI);
    bVar1 = ::operator==((QString *)lhs,(QLatin1StringView *)in_RDI);
    if (bVar1) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_1a0,(Data *)0x0,L"plus",4);
      QString::QString((QString *)in_RDI,(DataPointer *)CONCAT44(other,in_stack_fffffffffffffd48));
      QList<QString>::operator<<
                ((QList<QString> *)in_RDI,(rvalue_ref)CONCAT44(other,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0xaf75b7);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
    }
    else {
      local_1b0 = Qt::Literals::StringLiterals::operator____L1((char *)lhs,(size_t)in_RDI);
      bVar1 = ::operator==((QString *)lhs,(QLatin1StringView *)in_RDI);
      if (bVar1) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_1e0,(Data *)0x0,L"minus",5);
        QString::QString((QString *)in_RDI,(DataPointer *)CONCAT44(other,in_stack_fffffffffffffd48))
        ;
        QList<QString>::operator<<
                  ((QList<QString> *)in_RDI,(rvalue_ref)CONCAT44(other,in_stack_fffffffffffffd48));
        QString::~QString((QString *)0xaf767d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
      }
      else {
        QList<QString>::operator<<
                  ((QList<QString> *)in_RDI,
                   (parameter_type)CONCAT44(other,in_stack_fffffffffffffd48));
      }
    }
    QList<QList<QString>_>::operator<<
              ((QList<QList<QString>_> *)in_RDI,
               (parameter_type)CONCAT44(other,in_stack_fffffffffffffd48));
    QString::~QString((QString *)0xaf76c2);
    QList<QString>::~QList((QList<QString> *)0xaf76cf);
    local_2a0 = local_2a0 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDBusMenuShortcut *)lhs;
  }
  __stack_chk_fail();
}

Assistant:

QDBusMenuShortcut QDBusMenuItem::convertKeySequence(const QKeySequence &sequence)
{
    QDBusMenuShortcut shortcut;
    for (int i = 0; i < sequence.count(); ++i) {
        QStringList tokens;
        auto modifiers = sequence[i].keyboardModifiers();
        if (modifiers & Qt::MetaModifier)
            tokens << QStringLiteral("Super");
        if (modifiers & Qt::ControlModifier)
            tokens << QStringLiteral("Control");
        if (modifiers & Qt::AltModifier)
            tokens << QStringLiteral("Alt");
        if (modifiers & Qt::ShiftModifier)
            tokens << QStringLiteral("Shift");
        if (modifiers & Qt::KeypadModifier)
            tokens << QStringLiteral("Num");

        QString keyName = QKeySequencePrivate::keyName(sequence[i].key(), QKeySequence::PortableText);
        if (keyName == "+"_L1)
            tokens << QStringLiteral("plus");
        else if (keyName == "-"_L1)
            tokens << QStringLiteral("minus");
        else
            tokens << keyName;
        shortcut << tokens;
    }
    return shortcut;
}